

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_parser.cpp
# Opt level: O3

string * __thiscall
duckdb::SQLLogicParser::ExtractStatement_abi_cxx11_
          (string *__return_storage_ptr__,SQLLogicParser *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  ulong __n;
  bool bVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __n = this->current_line;
  if (__n < (ulong)((long)(this->lines).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->lines).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    this_00 = &this->lines;
    bVar5 = true;
    do {
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](this_00,__n);
      bVar2 = EmptyOrComment((string *)pvVar4);
      if (bVar2) {
        return __return_storage_ptr__;
      }
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](this_00,this->current_line);
      iVar3 = std::__cxx11::string::compare((char *)pvVar4);
      if (iVar3 == 0) {
        return __return_storage_ptr__;
      }
      if (!bVar5) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](this_00,this->current_line);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pvVar4->_M_dataplus)._M_p);
      pbVar1 = (this->lines).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __n = this->current_line + 1;
      this->current_line = __n;
      bVar5 = false;
    } while (__n < (ulong)((long)pbVar1 -
                           (long)(this->lines).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

string SQLLogicParser::ExtractStatement() {
	string statement;

	bool first_line = true;
	while (current_line < lines.size() && !EmptyOrComment(lines[current_line])) {
		if (lines[current_line] == "----") {
			break;
		}
		if (!first_line) {
			statement += "\n";
		}
		statement += lines[current_line];
		first_line = false;

		current_line++;
	}

	return statement;
}